

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void switch_tile_and_get_next_job
               (AV1_COMMON *cm,TileDataEnc *tile_data,int *cur_tile_id,int *current_mi_row,
               int *end_of_frame,int is_firstpass,BLOCK_SIZE fp_block_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TileInfo *tile;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  undefined4 *in_R8;
  int in_R9D;
  BLOCK_SIZE in_stack_00000008;
  int unit_height;
  int num_mis_to_encode;
  int num_threads_working;
  int theoretical_limit_on_threads;
  int num_b_cols_in_tile;
  int num_b_rows_in_tile;
  AV1EncRowMultiThreadSync *row_mt_sync;
  TileDataEnc *this_tile;
  int tile_index;
  int tile_col;
  int tile_row;
  int min_num_threads_working;
  int max_mis_to_encode;
  int tile_id;
  int tile_rows;
  int tile_cols;
  uint local_9c;
  int local_84;
  int local_80;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  iVar1 = (in_RDI->tiles).cols;
  iVar2 = (in_RDI->tiles).rows;
  local_38 = -1;
  local_3c = 0;
  local_40 = 0x7fffffff;
  for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
      iVar4 = local_44 * iVar1 + local_48;
      tile = (TileInfo *)(in_RSI + (long)iVar4 * 0x5d10);
      if (in_R9D == 0) {
        local_84 = av1_get_sb_rows_in_tile(in_RDI,tile);
        local_80 = av1_get_sb_cols_in_tile(in_RDI,tile);
      }
      else {
        local_84 = av1_get_unit_rows_in_tile(tile,in_stack_00000008);
        local_80 = av1_get_unit_cols_in_tile(tile,in_stack_00000008);
      }
      if (local_80 + 1 >> 1 < local_84) {
        local_84 = local_80 + 1 >> 1;
      }
      iVar3 = tile[0x3e0].mi_row_start;
      if ((iVar3 < local_84) && (iVar5 = tile->mi_row_end - tile[0x3df].tile_col, 0 < iVar5)) {
        if (iVar3 < local_40) {
          local_3c = 0;
          local_40 = iVar3;
        }
        if ((iVar3 == local_40) && (local_3c < iVar5)) {
          local_3c = iVar5;
          local_38 = iVar4;
        }
      }
    }
  }
  if (local_38 == -1) {
    *in_R8 = 1;
  }
  else {
    *in_RDX = local_38;
    local_9c = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [in_stack_00000008];
    if (in_R9D == 0) {
      local_9c = in_RDI->seq_params->mib_size;
    }
    get_next_job((TileDataEnc *)(in_RSI + (long)local_38 * 0x5d10),in_RCX,local_9c);
  }
  return;
}

Assistant:

static inline void switch_tile_and_get_next_job(
    AV1_COMMON *const cm, TileDataEnc *const tile_data, int *cur_tile_id,
    int *current_mi_row, int *end_of_frame, int is_firstpass,
    const BLOCK_SIZE fp_block_size) {
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  int tile_id = -1;  // Stores the tile ID with minimum proc done
  int max_mis_to_encode = 0;
  int min_num_threads_working = INT_MAX;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

#if CONFIG_REALTIME_ONLY
      int num_b_rows_in_tile =
          av1_get_sb_rows_in_tile(cm, &this_tile->tile_info);
      int num_b_cols_in_tile =
          av1_get_sb_cols_in_tile(cm, &this_tile->tile_info);
#else
      int num_b_rows_in_tile =
          is_firstpass
              ? av1_get_unit_rows_in_tile(&this_tile->tile_info, fp_block_size)
              : av1_get_sb_rows_in_tile(cm, &this_tile->tile_info);
      int num_b_cols_in_tile =
          is_firstpass
              ? av1_get_unit_cols_in_tile(&this_tile->tile_info, fp_block_size)
              : av1_get_sb_cols_in_tile(cm, &this_tile->tile_info);
#endif
      int theoretical_limit_on_threads =
          AOMMIN((num_b_cols_in_tile + 1) >> 1, num_b_rows_in_tile);
      int num_threads_working = row_mt_sync->num_threads_working;

      if (num_threads_working < theoretical_limit_on_threads) {
        int num_mis_to_encode =
            this_tile->tile_info.mi_row_end - row_mt_sync->next_mi_row;

        // Tile to be processed by this thread is selected on the basis of
        // availability of jobs:
        // 1) If jobs are available, tile to be processed is chosen on the
        // basis of minimum number of threads working for that tile. If two or
        // more tiles have same number of threads working for them, then the
        // tile with maximum number of jobs available will be chosen.
        // 2) If no jobs are available, then end_of_frame is reached.
        if (num_mis_to_encode > 0) {
          if (num_threads_working < min_num_threads_working) {
            min_num_threads_working = num_threads_working;
            max_mis_to_encode = 0;
          }
          if (num_threads_working == min_num_threads_working &&
              num_mis_to_encode > max_mis_to_encode) {
            tile_id = tile_index;
            max_mis_to_encode = num_mis_to_encode;
          }
        }
      }
    }
  }
  if (tile_id == -1) {
    *end_of_frame = 1;
  } else {
    // Update the current tile id to the tile id that will be processed next,
    // which will be the least processed tile.
    *cur_tile_id = tile_id;
    const int unit_height = mi_size_high[fp_block_size];
    get_next_job(&tile_data[tile_id], current_mi_row,
                 is_firstpass ? unit_height : cm->seq_params->mib_size);
  }
}